

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.cc
# Opt level: O2

bool __thiscall
google::protobuf::internal::VerifyUTF8(internal *this,StringPiece str,char *field_name)

{
  bool bVar1;
  string sStack_48;
  StringPiece local_28;
  
  local_28.length_ = (stringpiece_ssize_type)str.ptr_;
  local_28.ptr_ = (char *)this;
  StringPiece::ToString_abi_cxx11_(&sStack_48,&local_28);
  bVar1 = IsStructurallyValidUTF8(&sStack_48);
  std::__cxx11::string::~string((string *)&sStack_48);
  if (!bVar1) {
    PrintUTF8ErrorLog((char *)str.length_,"parsing",false);
  }
  return bVar1;
}

Assistant:

bool VerifyUTF8(StringPiece str, const char* field_name) {
  if (!IsStructurallyValidUTF8(str)) {
    PrintUTF8ErrorLog(field_name, "parsing", false);
    return false;
  }
  return true;
}